

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O0

Suite * private_ACUtilsTest_ADynArray_getTestSuite(void)

{
  Suite *s_00;
  TCase *pTVar1;
  TCase *test_case_ADynArray_mixed;
  TCase *test_case_ADynArray_setRange;
  TCase *test_case_ADynArray_set;
  TCase *test_case_ADynArray_appendADynArray;
  TCase *test_case_ADynArray_appendArray;
  TCase *test_case_ADynArray_append;
  TCase *test_case_ADynArray_insertADynArray;
  TCase *test_case_ADynArray_insertArray;
  TCase *test_case_ADynArray_insert;
  TCase *test_case_ADynArray_remove;
  TCase *test_case_ADynArray_clear;
  TCase *test_case_ADynArray_shrinkToFit;
  TCase *test_case_ADynArray_reserve;
  TCase *test_case_ADynArray_buffer;
  TCase *test_case_ADynArray_capacity;
  TCase *test_case_ADynArray_size;
  TCase *test_case_ADynArray_setGrowStrategy;
  TCase *test_case_ADynArray_construct_destruct;
  Suite *s;
  
  s_00 = suite_create("ADynArray Test Suite");
  pTVar1 = tcase_create("ADynArray Test Case: ADynArray_construct / ADynArray_destruct");
  _tcase_add_test(pTVar1,test_ADynArray_construct_destruct_valid,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_construct_destruct_withAllocator_valid,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_construct_destruct_withAllocator_invalid,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_construct_destruct_noMemoryAvailable,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_construct_destruct_nullptr,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("ADynArray Test Case: ADynArray_setGrowStrategy");
  _tcase_add_test(pTVar1,test_ADynArray_setGrowStrategy,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("ADynArray Test Case: ADynArray_size");
  _tcase_add_test(pTVar1,test_ADynArray_size_valid,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_size_nullptr,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("ADynArray Test Case: ADynArray_capacity");
  _tcase_add_test(pTVar1,test_ADynArray_capacity_valid,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_capacity_nullptr,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("ADynArray Test Case: ADynArray_buffer");
  _tcase_add_test(pTVar1,test_ADynArray_buffer_valid,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_buffer_nullptr,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("ADynArray Test Case: ADynArray_reserve");
  _tcase_add_test(pTVar1,test_ADynArray_reserve_success_enoughCapacityBufferNotNull,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_reserve_success_enoughCapacityBufferNull,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_reserve_success_notEnoughCapacity,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_reserve_failure_biggerThanMaxCapacity,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_reserve_failure_noMemoryAvailable,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_reserve_failure_growStrategyNull,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_reserve_failure_nullptr,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("ADynArray Test Case: ADynArray_shrinkToFit");
  _tcase_add_test(pTVar1,test_ADynArray_shrinkToFit_success_hasLeastCapacityBufferNotNull,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_shrinkToFit_success_hasLeastCapacityBufferNull,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_shrinkToFit_success_hasNotLeastCapacity,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_shrinkToFit_failure_noMemoryAvailable,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_shrinkToFit_failure_growStrategyNull,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_shrinkToFit_failure_nullptr,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("ADynArray Test Case: ADynArray_clear");
  _tcase_add_test(pTVar1,test_ADynArray_clear,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_clear_nullptr,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("ADynArray Test Case: ADynArray_remove");
  _tcase_add_test(pTVar1,test_ADynArray_remove_indexRangeInBounds,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_remove_rangeBeyondBounds,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_remove_zeroRange,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_remove_indexBeyoundBounds,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_remove_nullptr,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("ADynArray Test Case: ADynArray_insert");
  _tcase_add_test(pTVar1,test_ADynArray_insert_success_zeroIndex,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_insert_success_middleIndex,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_insert_success_endIndex,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_insert_success_beyondEndIndex,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_insert_success_bufferExpanded,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_insert_success_negativeIndexGetsMaxIndex,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_insert_failure_bufferExpansionFailed,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_insert_failure_nullptr,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("ADynArray Test Case: ADynArray_insertArray");
  _tcase_add_test(pTVar1,test_ADynArray_insertArray_success_zeroIndex,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_insertArray_success_middleIndex,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_insertArray_success_endIndex,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_insertArray_success_beyondEndIndex,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_insertArray_success_bufferExpanded,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_insertArray_success_nullptrArray,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_insertArray_success_zeroArraySize,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_insertArray_success_negativeIndexGetsMaxIndex,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_insertArray_failure_bufferExpansionFailed,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_insertArray_failure_nullptrDestArray,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("ADynArray Test Case: ADynArray_insertADynArray");
  _tcase_add_test(pTVar1,test_ADynArray_insertADynArray_success_zeroIndex,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_insertADynArray_success_middleIndex,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_insertADynArray_success_endIndex,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_insertADynArray_success_beyondEndIndex,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_insertADynArray_success_bufferExpanded,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_insertADynArray_success_nullptrSrcArray,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_insertADynArray_success_zeroSizeSrcArray,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_insertADynArray_success_negativeIndexGetsMaxIndex,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_insertADynArray_failure_bufferExpansionFailed,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_insertADynArray_failure_nullptrDestArray,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("ADynArray Test Case: ADynArray_append");
  _tcase_add_test(pTVar1,test_ADynArray_append_success_enoughCapacity,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_append_success_notEnoughCapacity,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_append_failure_bufferExpansionFailed,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_append_failure_nullptr,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("ADynArray Test Case: ADynArray_appendArray");
  _tcase_add_test(pTVar1,test_ADynArray_appendArray_success_enoughCapacity,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_appendArray_success_notEnoughCapacity,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_appendArray_success_nullptrArray,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_appendArray_success_zeroArraySize,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_appendArray_failure_bufferExpansionFailed,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_appendArray_failure_nullptrDestArray,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("ADynArray Test Case: ADynArray_appendADynArray");
  _tcase_add_test(pTVar1,test_ADynArray_appendADynArray_success_enoughCapacity,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_appendADynArray_success_notEnoughCapacity,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_appendADynArray_success_nullptrSrcArray,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_appendADynArray_success_zeroSizeSrcArray,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_appendADynArray_failure_bufferExpansionFailed,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_appendADynArray_failure_nullptrDestArray,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("ADynArray Test Case: ADynArray_set");
  _tcase_add_test(pTVar1,test_ADynArray_set_success_indexInBounds,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_set_success_indexBeyondSize,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_set_success_indexBeyondSize_bufferExpanded,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_set_failure_indexBeyondSize_bufferExpansionFailed,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_set_failure_nullptr,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("ADynArray Test Case: ADynArray_setRange");
  _tcase_add_test(pTVar1,test_ADynArray_setRange_success_indexAndRangeInBounds,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_setRange_success_indexInBoundsRangeBeyondSize,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_setRange_success_indexInBoundsRangeBeyondSize_bufferExpanded
                  ,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_setRange_success_indexAndRangeBeyondSize,0,0,0,1);
  _tcase_add_test(pTVar1,test_ADynArray_setRange_success_indexAndRangeBeyondSize_bufferExpanded,0,0,
                  0,1);
  _tcase_add_test(pTVar1,
                  test_ADynArray_setRange_failure_indexInBoundsRangeBeyondSize_bufferExpansionFailed
                  ,0,0,0,1);
  _tcase_add_test(pTVar1,
                  test_ADynArray_setRange_failure_indexAndRangeBeyondSize_bufferExpansionFailed,0,0,
                  0,1);
  _tcase_add_test(pTVar1,test_ADynArray_setRange_failure_nullptr,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  pTVar1 = tcase_create("ADynArray Test Case: mixed tests");
  _tcase_add_test(pTVar1,test_ADynArray_mixedWithStruct,0,0,0,1);
  suite_add_tcase(s_00,pTVar1);
  return s_00;
}

Assistant:

Suite* private_ACUtilsTest_ADynArray_getTestSuite(void)
{
    Suite *s;
    TCase *test_case_ADynArray_construct_destruct, *test_case_ADynArray_setGrowStrategy, *test_case_ADynArray_size,
        *test_case_ADynArray_capacity, *test_case_ADynArray_buffer, *test_case_ADynArray_reserve,
        *test_case_ADynArray_shrinkToFit, *test_case_ADynArray_clear, *test_case_ADynArray_remove,
        *test_case_ADynArray_insert, *test_case_ADynArray_insertArray, *test_case_ADynArray_insertADynArray,
        *test_case_ADynArray_append, *test_case_ADynArray_appendArray, *test_case_ADynArray_appendADynArray,
        *test_case_ADynArray_set, *test_case_ADynArray_setRange, *test_case_ADynArray_mixed;

    s = suite_create("ADynArray Test Suite");

    test_case_ADynArray_construct_destruct = tcase_create("ADynArray Test Case: ADynArray_construct / ADynArray_destruct");
    tcase_add_test(test_case_ADynArray_construct_destruct, test_ADynArray_construct_destruct_valid);
    tcase_add_test(test_case_ADynArray_construct_destruct, test_ADynArray_construct_destruct_withAllocator_valid);
    tcase_add_test(test_case_ADynArray_construct_destruct, test_ADynArray_construct_destruct_withAllocator_invalid);
    tcase_add_test(test_case_ADynArray_construct_destruct, test_ADynArray_construct_destruct_noMemoryAvailable);
    tcase_add_test(test_case_ADynArray_construct_destruct, test_ADynArray_construct_destruct_nullptr);
    suite_add_tcase(s, test_case_ADynArray_construct_destruct);

    test_case_ADynArray_setGrowStrategy = tcase_create("ADynArray Test Case: ADynArray_setGrowStrategy");
    tcase_add_test(test_case_ADynArray_setGrowStrategy, test_ADynArray_setGrowStrategy);
    suite_add_tcase(s, test_case_ADynArray_setGrowStrategy);

    test_case_ADynArray_size = tcase_create("ADynArray Test Case: ADynArray_size");
    tcase_add_test(test_case_ADynArray_size, test_ADynArray_size_valid);
    tcase_add_test(test_case_ADynArray_size, test_ADynArray_size_nullptr);
    suite_add_tcase(s, test_case_ADynArray_size);

    test_case_ADynArray_capacity = tcase_create("ADynArray Test Case: ADynArray_capacity");
    tcase_add_test(test_case_ADynArray_capacity, test_ADynArray_capacity_valid);
    tcase_add_test(test_case_ADynArray_capacity, test_ADynArray_capacity_nullptr);
    suite_add_tcase(s, test_case_ADynArray_capacity);

    test_case_ADynArray_buffer = tcase_create("ADynArray Test Case: ADynArray_buffer");
    tcase_add_test(test_case_ADynArray_buffer, test_ADynArray_buffer_valid);
    tcase_add_test(test_case_ADynArray_buffer, test_ADynArray_buffer_nullptr);
    suite_add_tcase(s, test_case_ADynArray_buffer);

    test_case_ADynArray_reserve = tcase_create("ADynArray Test Case: ADynArray_reserve");
    tcase_add_test(test_case_ADynArray_reserve, test_ADynArray_reserve_success_enoughCapacityBufferNotNull);
    tcase_add_test(test_case_ADynArray_reserve, test_ADynArray_reserve_success_enoughCapacityBufferNull);
    tcase_add_test(test_case_ADynArray_reserve, test_ADynArray_reserve_success_notEnoughCapacity);
    tcase_add_test(test_case_ADynArray_reserve, test_ADynArray_reserve_failure_biggerThanMaxCapacity);
    tcase_add_test(test_case_ADynArray_reserve, test_ADynArray_reserve_failure_noMemoryAvailable);
    tcase_add_test(test_case_ADynArray_reserve, test_ADynArray_reserve_failure_growStrategyNull);
    tcase_add_test(test_case_ADynArray_reserve, test_ADynArray_reserve_failure_nullptr);
    suite_add_tcase(s, test_case_ADynArray_reserve);

    test_case_ADynArray_shrinkToFit = tcase_create("ADynArray Test Case: ADynArray_shrinkToFit");
    tcase_add_test(test_case_ADynArray_shrinkToFit, test_ADynArray_shrinkToFit_success_hasLeastCapacityBufferNotNull);
    tcase_add_test(test_case_ADynArray_shrinkToFit, test_ADynArray_shrinkToFit_success_hasLeastCapacityBufferNull);
    tcase_add_test(test_case_ADynArray_shrinkToFit, test_ADynArray_shrinkToFit_success_hasNotLeastCapacity);
    tcase_add_test(test_case_ADynArray_shrinkToFit, test_ADynArray_shrinkToFit_failure_noMemoryAvailable);
    tcase_add_test(test_case_ADynArray_shrinkToFit, test_ADynArray_shrinkToFit_failure_growStrategyNull);
    tcase_add_test(test_case_ADynArray_shrinkToFit, test_ADynArray_shrinkToFit_failure_nullptr);
    suite_add_tcase(s, test_case_ADynArray_shrinkToFit);

    test_case_ADynArray_clear = tcase_create("ADynArray Test Case: ADynArray_clear");
    tcase_add_test(test_case_ADynArray_clear, test_ADynArray_clear);
    tcase_add_test(test_case_ADynArray_clear, test_ADynArray_clear_nullptr);
    suite_add_tcase(s, test_case_ADynArray_clear);

    test_case_ADynArray_remove = tcase_create("ADynArray Test Case: ADynArray_remove");
    tcase_add_test(test_case_ADynArray_remove, test_ADynArray_remove_indexRangeInBounds);
    tcase_add_test(test_case_ADynArray_remove, test_ADynArray_remove_rangeBeyondBounds);
    tcase_add_test(test_case_ADynArray_remove, test_ADynArray_remove_zeroRange);
    tcase_add_test(test_case_ADynArray_remove, test_ADynArray_remove_indexBeyoundBounds);
    tcase_add_test(test_case_ADynArray_remove, test_ADynArray_remove_nullptr);
    suite_add_tcase(s, test_case_ADynArray_remove);

    test_case_ADynArray_insert = tcase_create("ADynArray Test Case: ADynArray_insert");
    tcase_add_test(test_case_ADynArray_insert, test_ADynArray_insert_success_zeroIndex);
    tcase_add_test(test_case_ADynArray_insert, test_ADynArray_insert_success_middleIndex);
    tcase_add_test(test_case_ADynArray_insert, test_ADynArray_insert_success_endIndex);
    tcase_add_test(test_case_ADynArray_insert, test_ADynArray_insert_success_beyondEndIndex);
    tcase_add_test(test_case_ADynArray_insert, test_ADynArray_insert_success_bufferExpanded);
    tcase_add_test(test_case_ADynArray_insert, test_ADynArray_insert_success_negativeIndexGetsMaxIndex);
    tcase_add_test(test_case_ADynArray_insert, test_ADynArray_insert_failure_bufferExpansionFailed);
    tcase_add_test(test_case_ADynArray_insert, test_ADynArray_insert_failure_nullptr);
    suite_add_tcase(s, test_case_ADynArray_insert);

    test_case_ADynArray_insertArray = tcase_create("ADynArray Test Case: ADynArray_insertArray");
    tcase_add_test(test_case_ADynArray_insertArray, test_ADynArray_insertArray_success_zeroIndex);
    tcase_add_test(test_case_ADynArray_insertArray, test_ADynArray_insertArray_success_middleIndex);
    tcase_add_test(test_case_ADynArray_insertArray, test_ADynArray_insertArray_success_endIndex);
    tcase_add_test(test_case_ADynArray_insertArray, test_ADynArray_insertArray_success_beyondEndIndex);
    tcase_add_test(test_case_ADynArray_insertArray, test_ADynArray_insertArray_success_bufferExpanded);
    tcase_add_test(test_case_ADynArray_insertArray, test_ADynArray_insertArray_success_nullptrArray);
    tcase_add_test(test_case_ADynArray_insertArray, test_ADynArray_insertArray_success_zeroArraySize);
    tcase_add_test(test_case_ADynArray_insertArray, test_ADynArray_insertArray_success_negativeIndexGetsMaxIndex);
    tcase_add_test(test_case_ADynArray_insertArray, test_ADynArray_insertArray_failure_bufferExpansionFailed);
    tcase_add_test(test_case_ADynArray_insertArray, test_ADynArray_insertArray_failure_nullptrDestArray);
    suite_add_tcase(s, test_case_ADynArray_insertArray);

    test_case_ADynArray_insertADynArray = tcase_create("ADynArray Test Case: ADynArray_insertADynArray");
    tcase_add_test(test_case_ADynArray_insertADynArray, test_ADynArray_insertADynArray_success_zeroIndex);
    tcase_add_test(test_case_ADynArray_insertADynArray, test_ADynArray_insertADynArray_success_middleIndex);
    tcase_add_test(test_case_ADynArray_insertADynArray, test_ADynArray_insertADynArray_success_endIndex);
    tcase_add_test(test_case_ADynArray_insertADynArray, test_ADynArray_insertADynArray_success_beyondEndIndex);
    tcase_add_test(test_case_ADynArray_insertADynArray, test_ADynArray_insertADynArray_success_bufferExpanded);
    tcase_add_test(test_case_ADynArray_insertADynArray, test_ADynArray_insertADynArray_success_nullptrSrcArray);
    tcase_add_test(test_case_ADynArray_insertADynArray, test_ADynArray_insertADynArray_success_zeroSizeSrcArray);
    tcase_add_test(test_case_ADynArray_insertADynArray, test_ADynArray_insertADynArray_success_negativeIndexGetsMaxIndex);
    tcase_add_test(test_case_ADynArray_insertADynArray, test_ADynArray_insertADynArray_failure_bufferExpansionFailed);
    tcase_add_test(test_case_ADynArray_insertADynArray, test_ADynArray_insertADynArray_failure_nullptrDestArray);
    suite_add_tcase(s, test_case_ADynArray_insertADynArray);

    test_case_ADynArray_append = tcase_create("ADynArray Test Case: ADynArray_append");
    tcase_add_test(test_case_ADynArray_append, test_ADynArray_append_success_enoughCapacity);
    tcase_add_test(test_case_ADynArray_append, test_ADynArray_append_success_notEnoughCapacity);
    tcase_add_test(test_case_ADynArray_append, test_ADynArray_append_failure_bufferExpansionFailed);
    tcase_add_test(test_case_ADynArray_append, test_ADynArray_append_failure_nullptr);
    suite_add_tcase(s, test_case_ADynArray_append);

    test_case_ADynArray_appendArray = tcase_create("ADynArray Test Case: ADynArray_appendArray");
    tcase_add_test(test_case_ADynArray_appendArray, test_ADynArray_appendArray_success_enoughCapacity);
    tcase_add_test(test_case_ADynArray_appendArray, test_ADynArray_appendArray_success_notEnoughCapacity);
    tcase_add_test(test_case_ADynArray_appendArray, test_ADynArray_appendArray_success_nullptrArray);
    tcase_add_test(test_case_ADynArray_appendArray, test_ADynArray_appendArray_success_zeroArraySize);
    tcase_add_test(test_case_ADynArray_appendArray, test_ADynArray_appendArray_failure_bufferExpansionFailed);
    tcase_add_test(test_case_ADynArray_appendArray, test_ADynArray_appendArray_failure_nullptrDestArray);
    suite_add_tcase(s, test_case_ADynArray_appendArray);

    test_case_ADynArray_appendADynArray = tcase_create("ADynArray Test Case: ADynArray_appendADynArray");
    tcase_add_test(test_case_ADynArray_appendADynArray, test_ADynArray_appendADynArray_success_enoughCapacity);
    tcase_add_test(test_case_ADynArray_appendADynArray, test_ADynArray_appendADynArray_success_notEnoughCapacity);
    tcase_add_test(test_case_ADynArray_appendADynArray, test_ADynArray_appendADynArray_success_nullptrSrcArray);
    tcase_add_test(test_case_ADynArray_appendADynArray, test_ADynArray_appendADynArray_success_zeroSizeSrcArray);
    tcase_add_test(test_case_ADynArray_appendADynArray, test_ADynArray_appendADynArray_failure_bufferExpansionFailed);
    tcase_add_test(test_case_ADynArray_appendADynArray, test_ADynArray_appendADynArray_failure_nullptrDestArray);
    suite_add_tcase(s, test_case_ADynArray_appendADynArray);

    test_case_ADynArray_set = tcase_create("ADynArray Test Case: ADynArray_set");
    tcase_add_test(test_case_ADynArray_set, test_ADynArray_set_success_indexInBounds);
    tcase_add_test(test_case_ADynArray_set, test_ADynArray_set_success_indexBeyondSize);
    tcase_add_test(test_case_ADynArray_set, test_ADynArray_set_success_indexBeyondSize_bufferExpanded);
    tcase_add_test(test_case_ADynArray_set, test_ADynArray_set_failure_indexBeyondSize_bufferExpansionFailed);
    tcase_add_test(test_case_ADynArray_set, test_ADynArray_set_failure_nullptr);
    suite_add_tcase(s, test_case_ADynArray_set);

    test_case_ADynArray_setRange = tcase_create("ADynArray Test Case: ADynArray_setRange");
    tcase_add_test(test_case_ADynArray_setRange, test_ADynArray_setRange_success_indexAndRangeInBounds);
    tcase_add_test(test_case_ADynArray_setRange, test_ADynArray_setRange_success_indexInBoundsRangeBeyondSize);
    tcase_add_test(test_case_ADynArray_setRange, test_ADynArray_setRange_success_indexInBoundsRangeBeyondSize_bufferExpanded);
    tcase_add_test(test_case_ADynArray_setRange, test_ADynArray_setRange_success_indexAndRangeBeyondSize);
    tcase_add_test(test_case_ADynArray_setRange, test_ADynArray_setRange_success_indexAndRangeBeyondSize_bufferExpanded);
    tcase_add_test(test_case_ADynArray_setRange, test_ADynArray_setRange_failure_indexInBoundsRangeBeyondSize_bufferExpansionFailed);
    tcase_add_test(test_case_ADynArray_setRange, test_ADynArray_setRange_failure_indexAndRangeBeyondSize_bufferExpansionFailed);
    tcase_add_test(test_case_ADynArray_setRange, test_ADynArray_setRange_failure_nullptr);
    suite_add_tcase(s, test_case_ADynArray_setRange);

    test_case_ADynArray_mixed = tcase_create("ADynArray Test Case: mixed tests");
    tcase_add_test(test_case_ADynArray_mixed, test_ADynArray_mixedWithStruct);
    suite_add_tcase(s, test_case_ADynArray_mixed);

    return s;
}